

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollAdapterBase.cpp
# Opt level: O2

void __thiscall
cursespp::ScrollAdapterBase::DrawPage
          (ScrollAdapterBase *this,ScrollableWindow *scrollable,size_t index,ScrollPosition *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  size_t sVar6;
  size_type sVar7;
  __shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined4 extraout_var_01;
  shared_ptr<cursespp::IScrollAdapter::IEntry> *__args_3;
  ulong __n;
  ulong uVar9;
  ulong uVar10;
  EntryPtr entry;
  pointer local_118;
  wstring wstr;
  string line;
  __shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2> local_90;
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  visible;
  long lVar4;
  undefined4 extraout_var_00;
  
  iVar2 = (*(scrollable->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x22])
                    (scrollable);
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(scrollable->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x23])
                    (scrollable);
  if ((((lVar4 != 0) && ((char)iVar2 != '\0')) && (this->height != 0)) && (this->width != 0)) {
    werase(lVar4);
    std::
    _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::_Deque_base(&visible.
                   super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                 );
    iVar2 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])(this);
    uVar5 = CONCAT44(extraout_var_00,iVar2);
    if (uVar5 == 0) {
      sVar6 = 0;
      uVar10 = 0;
    }
    else {
      sVar6 = uVar5 - 1;
      if (index < uVar5) {
        sVar6 = index;
      }
      sVar6 = GetVisibleItems(this,scrollable,sVar6,&visible);
      __n = 0;
      uVar10 = 0;
      while( true ) {
        sVar7 = std::
                deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                ::size(&visible);
        if (sVar7 <= __n) break;
        p_Var8 = &std::
                  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                  ::at(&visible,__n)->
                  super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&entry.
                      super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                     ,p_Var8);
        iVar2 = (*(entry.
                   super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_IEntry[2])();
        wmove(lVar4,uVar10 & 0xffffffff,0);
        for (__args_3 = (shared_ptr<cursespp::IScrollAdapter::IEntry> *)0x0;
            (uVar9 = (long)&(__args_3->
                            super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + uVar10,
            __args_3 <
            (shared_ptr<cursespp::IScrollAdapter::IEntry> *)CONCAT44(extraout_var_01,iVar2) &&
            (uVar9 < this->height));
            __args_3 = (shared_ptr<cursespp::IScrollAdapter::IEntry> *)
                       ((long)&(__args_3->
                               super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + 1)) {
          if ((this->decorator).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001911ba:
            (*(entry.
               super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_IEntry[5])
                      (&wstr,entry.
                             super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,__args_3);
            local_118 = wstr._M_dataplus._M_p;
            if (wstr._M_dataplus._M_p != (pointer)0xffffffffffffffff) goto LAB_001911d6;
            bVar1 = true;
            local_118 = (pointer)0xffffffffffffffff;
          }
          else {
            std::__shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr(&local_90,
                         &entry.
                          super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                        );
            std::
            function<cursespp::Color_(cursespp::ScrollableWindow_*,_unsigned_long,_unsigned_long,_std::shared_ptr<cursespp::IScrollAdapter::IEntry>)>
            ::operator()((function<cursespp::Color_(cursespp::ScrollableWindow_*,_unsigned_long,_unsigned_long,_std::shared_ptr<cursespp::IScrollAdapter::IEntry>)>
                          *)&wstr,(ScrollableWindow *)&this->decorator,(unsigned_long)scrollable,
                         sVar6 + __n,__args_3);
            local_118 = wstr._M_dataplus._M_p;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
            if (local_118 == (pointer)0xffffffffffffffff) goto LAB_001911ba;
LAB_001911d6:
            bVar1 = false;
            wattr_on(lVar4,local_118,0);
          }
          (*(entry.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IEntry[3])
                    (&line,entry.
                           super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,__args_3);
          f8n::utf::u8to16(&wstr,&line);
          iVar3 = wcswidth(wstr._M_dataplus._M_p,wstr._M_string_length);
          if (iVar3 < 1) {
            iVar3 = (int)line._M_string_length;
          }
          std::__cxx11::wstring::~wstring((wstring *)&wstr);
          iVar3 = (int)this->width - iVar3;
          if (0 < iVar3) {
            wstr._M_dataplus._M_p = (pointer)&wstr.field_2;
            std::__cxx11::string::_M_construct((ulong)&wstr,(char)iVar3);
            std::__cxx11::string::append((string *)&line);
            std::__cxx11::string::~string((string *)&wstr);
          }
          wprintw(lVar4,"%s",line._M_dataplus._M_p);
          if (!bVar1) {
            wattr_off(lVar4,local_118,0);
          }
          std::__cxx11::string::~string((string *)&line);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&entry.
                    super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        __n = __n + 1;
        uVar10 = uVar9;
      }
    }
    sVar7 = std::
            deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
            ::size(&visible);
    result->visibleEntryCount = sVar7;
    result->firstVisibleEntryIndex = sVar6;
    result->lineCount = uVar10;
    result->totalEntries = uVar5;
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::~deque(&visible);
  }
  return;
}

Assistant:

void ScrollAdapterBase::DrawPage(ScrollableWindow* scrollable, size_t index, ScrollPosition& result) {
    WINDOW* window = scrollable->GetContent();

    if (!scrollable->IsVisible() || !window || this->height == 0 || this->width == 0) {
        return;
    }

    werase(window);

    std::deque<EntryPtr> visible;
    size_t drawnLines = 0;
    size_t topIndex = 0;
    size_t count = GetEntryCount();

    if (count > 0) {
        if (index >= count) {
            index = count - 1;
        }

        topIndex = GetVisibleItems(scrollable, index, visible);

        for (size_t e = 0; e < visible.size(); e++) {
            EntryPtr entry = visible.at(e);
            size_t count = entry->GetLineCount();
            wmove(window, drawnLines, 0);

            for (size_t i = 0; i < count && drawnLines < this->height; i++) {
                Color attrs = Color::Default;

                if (this->decorator) {
                    attrs = this->decorator(scrollable, topIndex + e, i, entry);
                }

                if (attrs == -1) {
                    attrs = entry->GetAttrs(i);
                }

                if (attrs != -1) {
                    wattron(window, attrs);
                }

                std::string line = entry->GetLine(i);
                size_t len = u8cols(line);

                /* pad with empty spaces to the end of the line. this allows us to
                do highlight rows. this should probably be configurable. */

                int remain = this->width - len;
                if (remain > 0) {
                    line += std::string(remain, ' ');
                }

                /* string is padded above, we don't need a \n */
                checked_wprintw(window, "%s", line.c_str());

                if (attrs != -1) {
                    wattroff(window, attrs);
                }

                ++drawnLines;
            }
        }
    }

    result.visibleEntryCount = visible.size();
    result.firstVisibleEntryIndex = topIndex;
    result.lineCount = drawnLines;
    result.totalEntries = count;
}